

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateEnumStub
          (PythonStubGenerator *this,stringstream *stub,EnumDef *enum_def,Imports *imports)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppEVar3;
  EnumVal *pEVar4;
  PythonStubGenerator *this_00;
  Imports *imports_00;
  ostream *poVar5;
  BaseType type;
  long lVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer ppEVar9;
  string local_a8;
  string local_88;
  EnumDef *local_68;
  Imports *local_60;
  PythonStubGenerator *local_58;
  string local_50;
  
  poVar8 = (ostream *)(stub + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"class ",6);
  pIVar1 = &this->namer_;
  local_68 = enum_def;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_a8,pIVar1,enum_def);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_60 = imports;
  local_58 = this;
  if ((this->version_).major == 3) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"enum","");
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"IntEnum","");
    Imports::Import(imports,&local_a8,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    pcVar7 = "(IntEnum)";
    lVar6 = 9;
  }
  else {
    pcVar7 = "(object)";
    lVar6 = 8;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,lVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,":\n",2);
  ppEVar3 = (local_68->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  this_00 = local_58;
  for (ppEVar9 = (local_68->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_58 = this_00, ppEVar9 != ppEVar3;
      ppEVar9 = ppEVar9 + 1) {
    pEVar4 = *ppEVar9;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
    (*(pIVar1->super_Namer)._vptr_Namer[0x13])(&local_a8,pIVar1,pEVar4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    (anonymous_namespace)::PythonStubGenerator::ScalarType_abi_cxx11_
              (&local_88,(PythonStubGenerator *)(ulong)(local_68->underlying_type).base_type,type);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    this_00 = local_58;
  }
  if (((this_00->parser_->opts).generate_object_based_api & local_68->is_union) != 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"flatbuffers","");
    paVar2 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"table","");
    imports_00 = local_60;
    Imports::Import(local_60,&local_a8,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"def ",4);
    (*(pIVar1->super_Namer)._vptr_Namer[6])(&local_a8,pIVar1,local_68);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Creator(union_type: ",0x14);
    (anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
              (&local_88,(PythonStubGenerator *)this_00,local_68,imports_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,", table: table.Table) -> ",0x19);
    (anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
              (&local_50,(PythonStubGenerator *)this_00,local_68,imports_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ...\n",6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenerateEnumStub(std::stringstream &stub, const EnumDef *enum_def,
                        Imports *imports) const {
    stub << "class " << namer_.Type(*enum_def);

    if (version_.major == 3){
      imports->Import("enum", "IntEnum");
      stub << "(IntEnum)";
    }
    else {
      stub << "(object)";
    }

    stub << ":\n";
    for (const EnumVal *val : enum_def->Vals()) {
      stub << "  " << namer_.Variant(*val) << ": "
           << ScalarType(enum_def->underlying_type.base_type) << "\n";
    }

    if (parser_.opts.generate_object_based_api & enum_def->is_union) {
      imports->Import("flatbuffers", "table");
      stub << "def " << namer_.Function(*enum_def)
           << "Creator(union_type: " << EnumType(*enum_def, imports)
           << ", table: table.Table) -> " << UnionType(*enum_def, imports)
           << ": ...\n";
    }
  }